

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

RK_U32 is_long_term_reference(H264_FrameStore_t *fs)

{
  H264_FrameStore_t *fs_local;
  
  if (((fs->is_used == 3) && (fs->frame->used_for_reference != 0)) &&
     (fs->frame->is_long_term != '\0')) {
    fs_local._4_4_ = 1;
  }
  else if ((((fs->is_used & 1U) == 0) || (fs->top_field == (h264_store_pic_t *)0x0)) ||
          ((fs->top_field->used_for_reference == 0 || (fs->top_field->is_long_term == '\0')))) {
    if ((((fs->is_used & 2U) == 0) || (fs->bottom_field == (h264_store_pic_t *)0x0)) ||
       ((fs->bottom_field->used_for_reference == 0 || (fs->bottom_field->is_long_term == '\0')))) {
      fs_local._4_4_ = 0;
    }
    else {
      fs_local._4_4_ = 1;
    }
  }
  else {
    fs_local._4_4_ = 1;
  }
  return fs_local._4_4_;
}

Assistant:

static RK_U32 is_long_term_reference(H264_FrameStore_t* fs)
{

    if (fs->is_used == 3) { // frame
        if ((fs->frame->used_for_reference) && (fs->frame->is_long_term)) {
            return 1;
        }
    }

    if (fs->is_used & 1) { // top field
        if (fs->top_field) {
            if ((fs->top_field->used_for_reference) && (fs->top_field->is_long_term)) {
                return 1;
            }
        }
    }

    if (fs->is_used & 2) { // bottom field
        if (fs->bottom_field) {
            if ((fs->bottom_field->used_for_reference) && (fs->bottom_field->is_long_term)) {
                return 1;
            }
        }
    }
    return 0;
}